

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O2

void __thiscall Imf_3_4::Context::Context(Context *this)

{
  element_type *pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_priv_exr_context_t_**,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_AcademySoftwareFoundation[P]openexr_src_lib_OpenEXR_ImfContext_cpp:109:35),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_20;
  
  pp_Var1 = (element_type *)operator_new(8);
  *pp_Var1 = (element_type)0x0;
  (this->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pp_Var1;
  (this->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_20._M_alloc = &__a2;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001e3048;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)pp_Var1;
  (this->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  local_20._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_priv_exr_context_t_**,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/lib/OpenEXR/ImfContext.cpp:109:35),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_20);
  return;
}

Assistant:

Context::Context ()
    : _ctxt (new exr_context_t(), [] (exr_context_t* todel) {
        exr_finish (todel);
        delete todel;
    })
{
}